

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
bas::Vector<bool,4ul,bas::RawAllocator>::Vector<4ul>
          (Vector<bool,4ul,bas::RawAllocator> *this,Vector<bool,_4UL,_bas::RawAllocator> *other)

{
  AlignedBuffer<4UL,_1UL> *pAVar1;
  size_t size;
  Vector<bool,4ul,bas::RawAllocator> *__dest;
  bool *pbVar2;
  ptrdiff_t _Num;
  
  size = Vector<bool,_4UL,_bas::RawAllocator>::size(other);
  pAVar1 = &other->m_small_buffer;
  if ((AlignedBuffer<4UL,_1UL> *)other->m_begin == pAVar1) {
    if (size < 5) {
      __dest = this + 0x19;
      *(Vector<bool,4ul,bas::RawAllocator> **)this = __dest;
      *(Vector<bool,4ul,bas::RawAllocator> **)(this + 8) = this + size + 0x19;
      *(Vector<bool,4ul,bas::RawAllocator> **)(this + 0x10) = this + 0x1d;
      if (size == 0) goto LAB_0010638c;
      pbVar2 = other->m_begin;
    }
    else {
      __dest = (Vector<bool,4ul,bas::RawAllocator> *)aligned_malloc(size,1);
      *(Vector<bool,4ul,bas::RawAllocator> **)this = __dest;
      *(Vector<bool,4ul,bas::RawAllocator> **)(this + 8) = __dest + size;
      *(Vector<bool,4ul,bas::RawAllocator> **)(this + 0x10) = __dest + size;
      pbVar2 = other->m_begin;
    }
    memmove(__dest,pbVar2,size);
  }
  else {
    *(bool **)this = other->m_begin;
    pbVar2 = other->m_capacity_end;
    *(bool **)(this + 8) = other->m_end;
    *(bool **)(this + 0x10) = pbVar2;
  }
LAB_0010638c:
  other->m_begin = (bool *)pAVar1;
  other->m_end = (bool *)pAVar1;
  other->m_capacity_end = (bool *)&other->field_0x1d;
  *(long *)(this + 0x20) = *(long *)(this + 8) - *(long *)this;
  other->m_debug_size = 0;
  return;
}

Assistant:

Vector(Vector<T, OtherN, Allocator> &&other) noexcept
        : m_allocator(other.m_allocator)
    {
        size_t size = other.size();

        if (other.is_small()) {
            if (size <= N) {
                /* Copy between inline buffers. */
                m_begin = this->small_buffer();
                m_end = m_begin + size;
                m_capacity_end = m_begin + N;
                uninitialized_relocate_n(other.m_begin, size, m_begin);
            }
            else {
                /* Copy from inline buffer to newly allocated buffer. */
                size_t capacity = size;
                m_begin = (T *)m_allocator.allocate(
                    sizeof(T) * capacity, std::alignment_of<T>::value);
                m_end = m_begin + size;
                m_capacity_end = m_begin + capacity;
                uninitialized_relocate_n(other.m_begin, size, m_begin);
            }
        }
        else {
            /* Steal the pointer. */
            m_begin = other.m_begin;
            m_end = other.m_end;
            m_capacity_end = other.m_capacity_end;
        }

        other.m_begin = other.small_buffer();
        other.m_end = other.m_begin;
        other.m_capacity_end = other.m_begin + OtherN;
        UPDATE_VECTOR_SIZE(this);
        UPDATE_VECTOR_SIZE(&other);
    }